

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_message.hpp
# Opt level: O3

void __thiscall
iutest::detail::iuStreamMessage::iuStreamMessage(iuStreamMessage *this,iuStreamMessage *rhs)

{
  string local_30;
  
  std::__cxx11::stringbuf::str();
  iu_global_format_stringstream::iu_global_format_stringstream(&this->m_stream,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

iuStreamMessage(const iuStreamMessage& rhs) : m_stream(rhs.GetString()) {}